

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::SizeRange::SharedCtor(SizeRange *this)

{
  this->lowerbound_ = 0;
  this->upperbound_ = 0;
  this->_cached_size_ = 0;
  return;
}

Assistant:

void SizeRange::SharedCtor() {
  ::memset(&lowerbound_, 0, reinterpret_cast<char*>(&upperbound_) -
    reinterpret_cast<char*>(&lowerbound_) + sizeof(upperbound_));
  _cached_size_ = 0;
}